

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSeq.c
# Opt level: O3

int Cec_ManCountNonConstOutputs(Gia_Man_t *pAig)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (pAig->pReprs == (Gia_Rpr_t *)0x0) {
    iVar4 = -1;
  }
  else {
    uVar1 = pAig->vCos->nSize;
    uVar3 = uVar1 - pAig->nRegs;
    if (uVar3 == 0 || (int)uVar1 < pAig->nRegs) {
      iVar4 = 0;
    }
    else {
      uVar6 = 0;
      uVar5 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar5 = uVar6;
      }
      iVar4 = 0;
      do {
        if (uVar5 == uVar6) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar2 = pAig->vCos->pArray[uVar6];
        if (((long)iVar2 < 0) || (pAig->nObjs <= iVar2)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (pAig->pObjs == (Gia_Obj_t *)0x0) {
          return iVar4;
        }
        iVar4 = (iVar4 + 1) -
                (uint)(((uint)pAig->pReprs
                              [(int)(iVar2 - (*(uint *)(pAig->pObjs + iVar2) & 0x1fffffff))] &
                       0xfffffff) == 0);
        uVar6 = uVar6 + 1;
      } while (uVar3 != uVar6);
    }
  }
  return iVar4;
}

Assistant:

int Cec_ManCountNonConstOutputs( Gia_Man_t * pAig )
{
    Gia_Obj_t * pObj;
    int i, Counter = 0;
    if ( pAig->pReprs == NULL )
        return -1;
    Gia_ManForEachPo( pAig, pObj, i )
        if ( !Gia_ObjIsConst( pAig, Gia_ObjFaninId0p(pAig, pObj) ) )
            Counter++;
    return Counter;
}